

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O3

bool __thiscall QThreadPool::contains(QThreadPool *this,QThread *thread)

{
  qsizetype *this_00;
  long lVar1;
  void *copy;
  QObjectData *pQVar2;
  QThreadPoolThread *pQVar3;
  Node<QThreadPoolThread_*,_QHashDummyValue> *pNVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QThreadPoolThread *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QObject).d_ptr.d;
  pQVar3 = (QThreadPoolThread *)
           QMetaObject::cast(&QThreadPoolThread::staticMetaObject,&thread->super_QObject);
  if (pQVar3 == (QThreadPoolThread *)0x0) {
    bVar5 = false;
    goto LAB_003c8920;
  }
  this_00 = &pQVar2[1].children.d.size;
  if (pQVar2[1].children.d.size == 0) {
    LOCK();
    lVar1 = *this_00;
    if (lVar1 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar1 != 0) goto LAB_003c88db;
  }
  else {
LAB_003c88db:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  local_30 = pQVar3;
  if (*(Data<QHashPrivate::Node<QThreadPoolThread*,QHashDummyValue>> **)&pQVar2[1].field_0x30 ==
      (Data<QHashPrivate::Node<QThreadPoolThread*,QHashDummyValue>> *)0x0) {
    bVar5 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QThreadPoolThread*,QHashDummyValue>>::
             findNode<QThreadPoolThread*>
                       (*(Data<QHashPrivate::Node<QThreadPoolThread*,QHashDummyValue>> **)
                         &pQVar2[1].field_0x30,&local_30);
    bVar5 = pNVar4 != (Node<QThreadPoolThread_*,_QHashDummyValue> *)0x0;
  }
  LOCK();
  copy = (void *)*this_00;
  *this_00 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
LAB_003c8920:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QThreadPool::contains(const QThread *thread) const
{
    Q_D(const QThreadPool);
    const QThreadPoolThread *poolThread = qobject_cast<const QThreadPoolThread *>(thread);
    if (!poolThread)
        return false;
    QMutexLocker locker(&d->mutex);
    return d->allThreads.contains(const_cast<QThreadPoolThread *>(poolThread));
}